

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_damped_harmonic_symplectic.c
# Opt level: O3

sunrealtype Hamiltonian(N_Vector yvec,sunrealtype t)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pdVar3 = (double *)N_VGetArrayPointer();
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  dVar4 = sin(t / 3.141592653589793);
  dVar4 = exp(dVar4 * -0.018);
  dVar5 = cos(t * 0.5);
  dVar6 = cos(t * 0.5);
  dVar7 = sin(t / 3.141592653589793);
  dVar7 = exp(dVar7 * 0.018);
  return dVar7 * dVar2 * dVar6 * dVar5 * dVar2 * 0.5 + dVar4 * dVar1 * dVar1 * 0.5;
}

Assistant:

sunrealtype Hamiltonian(N_Vector yvec, sunrealtype t)
{
  sunrealtype H       = SUN_RCONST(0.0);
  sunrealtype* y      = N_VGetArrayPointer(yvec);
  const sunrealtype p = y[0];
  const sunrealtype q = y[1];

  H = (p * p * exp(-F(t))) / SUN_RCONST(2.0) +
      (omega(t) * omega(t) * q * q * exp(F(t))) / SUN_RCONST(2.0);

  return H;
}